

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psread.c
# Opt level: O0

FT_Fast cf2_buf_readByte(CF2_Buffer buf)

{
  byte *pbVar1;
  CF2_Buffer buf_local;
  
  if (buf->ptr < buf->end) {
    pbVar1 = buf->ptr;
    buf->ptr = pbVar1 + 1;
    buf_local._4_4_ = (uint)*pbVar1;
  }
  else {
    cf2_setError(buf->error,0x55);
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( CF2_Int )
  cf2_buf_readByte( CF2_Buffer  buf )
  {
    if ( buf->ptr < buf->end )
    {
#if CF2_IO_FAIL
      if ( randomError2() )
      {
        CF2_SET_ERROR( buf->error, Invalid_Stream_Operation );
        return 0;
      }

      return *(buf->ptr)++ + randomValue();
#else
      return *(buf->ptr)++;
#endif
    }
    else
    {
      CF2_SET_ERROR( buf->error, Invalid_Stream_Operation );
      return 0;
    }
  }